

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  mbedtls_mpi T;
  char *local_50;
  mbedtls_mpi local_48;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  sVar3 = mbedtls_mpi_bitlen(X);
  uVar4 = ((sVar3 >> (3 < radix)) >> (0xf < radix)) + 3;
  if (buflen < uVar4) {
    *olen = uVar4;
    return -8;
  }
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_50 = buf;
  if (X->s == -1) {
    local_50 = buf + 1;
    *buf = '-';
  }
  if (radix == 0x10) {
    sVar3 = X->n;
    if (sVar3 != 0) {
      bVar1 = false;
      do {
        lVar5 = 0x38;
        sVar6 = 0xfffffffffffffffa;
        do {
          uVar4 = X->p[sVar3 - 1] >> ((byte)lVar5 & 0x3f);
          uVar7 = uVar4 & 0xff;
          if (((sVar3 == sVar6) || ((int)uVar7 != 0)) || (bVar1)) {
            *local_50 = "0123456789ABCDEF"[uVar7 >> 4];
            local_50[1] = "0123456789ABCDEF"[(uint)uVar4 & 0xf];
            local_50 = local_50 + 2;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          lVar5 = lVar5 + -8;
          sVar6 = sVar6 + 1;
        } while (lVar5 != -8);
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&local_48,X);
    if (iVar2 != 0) goto LAB_0014d238;
    if (local_48.s == -1) {
      local_48.s = 1;
    }
    iVar2 = mpi_write_hlp(&local_48,radix,&local_50);
    if (iVar2 != 0) goto LAB_0014d238;
  }
  *local_50 = '\0';
  *olen = (long)(local_50 + 1) - (long)buf;
  iVar2 = 0;
  local_50 = local_50 + 1;
LAB_0014d238:
  mbedtls_mpi_free(&local_48);
  return iVar2;
}

Assistant:

int mbedtls_mpi_write_string( const mbedtls_mpi *X, int radix,
                              char *buf, size_t buflen, size_t *olen )
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    n = mbedtls_mpi_bitlen( X );
    if( radix >=  4 ) n >>= 1;
    if( radix >= 16 ) n >>= 1;
    n += 3;

    if( buflen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
    }

    p = buf;
    mbedtls_mpi_init( &T );

    if( X->s == -1 )
        *p++ = '-';

    if( radix == 16 )
    {
        int c;
        size_t i, j, k;

        for( i = X->n, k = 0; i > 0; i-- )
        {
            for( j = ciL; j > 0; j-- )
            {
                c = ( X->p[i - 1] >> ( ( j - 1 ) << 3) ) & 0xFF;

                if( c == 0 && k == 0 && ( i + j ) != 2 )
                    continue;

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T, X ) );

        if( T.s == -1 )
            T.s = 1;

        MBEDTLS_MPI_CHK( mpi_write_hlp( &T, radix, &p ) );
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}